

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAxyzDDD.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChNodeFEAxyzDDD::NodeIntLoadResidual_Mv
          (ChNodeFEAxyzDDD *this,uint off,ChVectorDynamic<> *R,ChVectorDynamic<> *w,double c)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  double *pdVar13;
  int iVar14;
  ulong uVar15;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  double dVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  
  uVar15 = (ulong)off;
  dVar16 = c;
  (*(this->super_ChNodeFEAxyzDD).super_ChNodeFEAxyzD.super_ChNodeFEAxyz.super_ChNodeFEAbase.
    _vptr_ChNodeFEAbase[9])();
  if ((long)uVar15 <
      (w->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows) {
    if ((long)uVar15 <
        (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows) {
      dVar16 = dVar16 * c;
      auVar29._8_8_ = 0;
      auVar29._0_8_ =
           (w->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
           [uVar15];
      pdVar13 = (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
      ;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = pdVar13[uVar15];
      auVar17._8_8_ = 0;
      auVar17._0_8_ = dVar16;
      auVar1 = vfmadd213sd_fma(auVar29,auVar17,auVar1);
      pdVar13[uVar15] = auVar1._0_8_;
      (*(this->super_ChNodeFEAxyzDD).super_ChNodeFEAxyzD.super_ChNodeFEAxyz.super_ChNodeFEAbase.
        _vptr_ChNodeFEAbase[9])(this);
      uVar15 = (ulong)(off + 1);
      if ((w->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows <=
          (long)uVar15) goto LAB_0066a477;
      if ((long)uVar15 <
          (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows) {
        dVar16 = dVar16 * c;
        auVar30._8_8_ = 0;
        auVar30._0_8_ =
             (w->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
             [uVar15];
        pdVar13 = (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                  m_data;
        auVar2._8_8_ = 0;
        auVar2._0_8_ = pdVar13[uVar15];
        auVar18._8_8_ = 0;
        auVar18._0_8_ = dVar16;
        auVar1 = vfmadd213sd_fma(auVar30,auVar18,auVar2);
        pdVar13[uVar15] = auVar1._0_8_;
        (*(this->super_ChNodeFEAxyzDD).super_ChNodeFEAxyzD.super_ChNodeFEAxyz.super_ChNodeFEAbase.
          _vptr_ChNodeFEAbase[9])(this);
        uVar15 = (ulong)(off + 2);
        if ((w->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows <=
            (long)uVar15) goto LAB_0066a477;
        if ((long)uVar15 <
            (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows) {
          auVar31._8_8_ = 0;
          auVar31._0_8_ =
               (w->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
               [uVar15];
          pdVar13 = (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                    m_data;
          auVar3._8_8_ = 0;
          auVar3._0_8_ = pdVar13[uVar15];
          auVar19._8_8_ = 0;
          auVar19._0_8_ = dVar16 * c;
          auVar1 = vfmadd213sd_fma(auVar31,auVar19,auVar3);
          pdVar13[uVar15] = auVar1._0_8_;
          iVar14 = (*(this->super_ChNodeFEAxyzDD).super_ChNodeFEAxyzD.super_ChNodeFEAxyz.
                     super_ChNodeFEAbase._vptr_ChNodeFEAbase[0x23])(this);
          if (0 < (long)((undefined8 *)CONCAT44(extraout_var,iVar14))[1]) {
            uVar15 = (ulong)(off + 3);
            if ((w->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
                <= (long)uVar15) goto LAB_0066a477;
            if ((long)uVar15 <
                (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
               ) {
              auVar32._8_8_ = 0;
              auVar32._0_8_ =
                   (w->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                   m_data[uVar15];
              pdVar13 = (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                        m_storage.m_data;
              auVar4._8_8_ = 0;
              auVar4._0_8_ = pdVar13[uVar15];
              auVar20._8_8_ = 0;
              auVar20._0_8_ = c * **(double **)CONCAT44(extraout_var,iVar14);
              auVar1 = vfmadd213sd_fma(auVar32,auVar20,auVar4);
              pdVar13[uVar15] = auVar1._0_8_;
              iVar14 = (*(this->super_ChNodeFEAxyzDD).super_ChNodeFEAxyzD.super_ChNodeFEAxyz.
                         super_ChNodeFEAbase._vptr_ChNodeFEAbase[0x23])(this);
              if (1 < ((long *)CONCAT44(extraout_var_00,iVar14))[1]) {
                uVar15 = (ulong)(off + 4);
                if ((w->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                    m_rows <= (long)uVar15) goto LAB_0066a477;
                if ((long)uVar15 <
                    (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                    m_rows) {
                  auVar33._8_8_ = 0;
                  auVar33._0_8_ =
                       (w->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage
                       .m_data[uVar15];
                  pdVar13 = (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                            m_storage.m_data;
                  auVar5._8_8_ = 0;
                  auVar5._0_8_ = pdVar13[uVar15];
                  auVar21._8_8_ = 0;
                  auVar21._0_8_ = c * *(double *)(*(long *)CONCAT44(extraout_var_00,iVar14) + 8);
                  auVar1 = vfmadd213sd_fma(auVar33,auVar21,auVar5);
                  pdVar13[uVar15] = auVar1._0_8_;
                  iVar14 = (*(this->super_ChNodeFEAxyzDD).super_ChNodeFEAxyzD.super_ChNodeFEAxyz.
                             super_ChNodeFEAbase._vptr_ChNodeFEAbase[0x23])(this);
                  if (2 < ((long *)CONCAT44(extraout_var_01,iVar14))[1]) {
                    uVar15 = (ulong)(off + 5);
                    if ((w->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                        m_storage.m_rows <= (long)uVar15) goto LAB_0066a477;
                    if ((long)uVar15 <
                        (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                        m_storage.m_rows) {
                      auVar34._8_8_ = 0;
                      auVar34._0_8_ =
                           (w->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                           m_storage.m_data[uVar15];
                      pdVar13 = (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                                m_storage.m_data;
                      auVar6._8_8_ = 0;
                      auVar6._0_8_ = pdVar13[uVar15];
                      auVar22._8_8_ = 0;
                      auVar22._0_8_ =
                           c * *(double *)(*(long *)CONCAT44(extraout_var_01,iVar14) + 0x10);
                      auVar1 = vfmadd213sd_fma(auVar34,auVar22,auVar6);
                      pdVar13[uVar15] = auVar1._0_8_;
                      iVar14 = (*(this->super_ChNodeFEAxyzDD).super_ChNodeFEAxyzD.super_ChNodeFEAxyz
                                 .super_ChNodeFEAbase._vptr_ChNodeFEAbase[0x2e])(this);
                      if (0 < (long)((undefined8 *)CONCAT44(extraout_var_02,iVar14))[1]) {
                        uVar15 = (ulong)(off + 6);
                        if ((w->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                            m_storage.m_rows <= (long)uVar15) goto LAB_0066a477;
                        if ((long)uVar15 <
                            (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                            m_storage.m_rows) {
                          auVar35._8_8_ = 0;
                          auVar35._0_8_ =
                               (w->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                               m_storage.m_data[uVar15];
                          pdVar13 = (R->
                                    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                                    m_storage.m_data;
                          auVar7._8_8_ = 0;
                          auVar7._0_8_ = pdVar13[uVar15];
                          auVar23._8_8_ = 0;
                          auVar23._0_8_ = c * **(double **)CONCAT44(extraout_var_02,iVar14);
                          auVar1 = vfmadd213sd_fma(auVar35,auVar23,auVar7);
                          pdVar13[uVar15] = auVar1._0_8_;
                          iVar14 = (*(this->super_ChNodeFEAxyzDD).super_ChNodeFEAxyzD.
                                     super_ChNodeFEAxyz.super_ChNodeFEAbase._vptr_ChNodeFEAbase
                                     [0x2e])(this);
                          if (1 < ((long *)CONCAT44(extraout_var_03,iVar14))[1]) {
                            uVar15 = (ulong)(off + 7);
                            if ((w->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                                m_storage.m_rows <= (long)uVar15) goto LAB_0066a477;
                            if ((long)uVar15 <
                                (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                                m_storage.m_rows) {
                              auVar36._8_8_ = 0;
                              auVar36._0_8_ =
                                   (w->
                                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                                   m_storage.m_data[uVar15];
                              pdVar13 = (R->
                                        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                        ).m_storage.m_data;
                              auVar8._8_8_ = 0;
                              auVar8._0_8_ = pdVar13[uVar15];
                              auVar24._8_8_ = 0;
                              auVar24._0_8_ =
                                   c * *(double *)(*(long *)CONCAT44(extraout_var_03,iVar14) + 8);
                              auVar1 = vfmadd213sd_fma(auVar36,auVar24,auVar8);
                              pdVar13[uVar15] = auVar1._0_8_;
                              iVar14 = (*(this->super_ChNodeFEAxyzDD).super_ChNodeFEAxyzD.
                                         super_ChNodeFEAxyz.super_ChNodeFEAbase._vptr_ChNodeFEAbase
                                         [0x2e])(this);
                              if (2 < ((long *)CONCAT44(extraout_var_04,iVar14))[1]) {
                                uVar15 = (ulong)(off + 8);
                                if ((w->
                                    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                                    m_storage.m_rows <= (long)uVar15) goto LAB_0066a477;
                                if ((long)uVar15 <
                                    (R->
                                    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                                    m_storage.m_rows) {
                                  auVar37._8_8_ = 0;
                                  auVar37._0_8_ =
                                       (w->
                                       super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                       ).m_storage.m_data[uVar15];
                                  pdVar13 = (R->
                                            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                            ).m_storage.m_data;
                                  auVar9._8_8_ = 0;
                                  auVar9._0_8_ = pdVar13[uVar15];
                                  auVar25._8_8_ = 0;
                                  auVar25._0_8_ =
                                       c * *(double *)
                                            (*(long *)CONCAT44(extraout_var_04,iVar14) + 0x10);
                                  auVar1 = vfmadd213sd_fma(auVar37,auVar25,auVar9);
                                  pdVar13[uVar15] = auVar1._0_8_;
                                  iVar14 = (*(this->super_ChNodeFEAxyzDD).super_ChNodeFEAxyzD.
                                             super_ChNodeFEAxyz.super_ChNodeFEAbase.
                                             _vptr_ChNodeFEAbase[0x2f])(this);
                                  if (0 < (long)((undefined8 *)CONCAT44(extraout_var_05,iVar14))[1])
                                  {
                                    uVar15 = (ulong)(off + 9);
                                    if ((w->
                                        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                        ).m_storage.m_rows <= (long)uVar15) goto LAB_0066a477;
                                    if ((long)uVar15 <
                                        (R->
                                        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                        ).m_storage.m_rows) {
                                      auVar38._8_8_ = 0;
                                      auVar38._0_8_ =
                                           (w->
                                           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                           ).m_storage.m_data[uVar15];
                                      pdVar13 = (R->
                                                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                ).m_storage.m_data;
                                      auVar10._8_8_ = 0;
                                      auVar10._0_8_ = pdVar13[uVar15];
                                      auVar26._8_8_ = 0;
                                      auVar26._0_8_ =
                                           c * **(double **)CONCAT44(extraout_var_05,iVar14);
                                      auVar1 = vfmadd213sd_fma(auVar38,auVar26,auVar10);
                                      pdVar13[uVar15] = auVar1._0_8_;
                                      iVar14 = (*(this->super_ChNodeFEAxyzDD).super_ChNodeFEAxyzD.
                                                 super_ChNodeFEAxyz.super_ChNodeFEAbase.
                                                 _vptr_ChNodeFEAbase[0x2f])(this);
                                      if (1 < ((long *)CONCAT44(extraout_var_06,iVar14))[1]) {
                                        uVar15 = (ulong)(off + 10);
                                        if ((w->
                                            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                            ).m_storage.m_rows <= (long)uVar15) goto LAB_0066a477;
                                        if ((long)uVar15 <
                                            (R->
                                            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                            ).m_storage.m_rows) {
                                          auVar39._8_8_ = 0;
                                          auVar39._0_8_ =
                                               (w->
                                               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                               ).m_storage.m_data[uVar15];
                                          pdVar13 = (R->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  ).m_storage.m_data;
                                          auVar11._8_8_ = 0;
                                          auVar11._0_8_ = pdVar13[uVar15];
                                          auVar27._8_8_ = 0;
                                          auVar27._0_8_ =
                                               c * *(double *)
                                                    (*(long *)CONCAT44(extraout_var_06,iVar14) + 8);
                                          auVar1 = vfmadd213sd_fma(auVar39,auVar27,auVar11);
                                          pdVar13[uVar15] = auVar1._0_8_;
                                          iVar14 = (*(this->super_ChNodeFEAxyzDD).
                                                     super_ChNodeFEAxyzD.super_ChNodeFEAxyz.
                                                     super_ChNodeFEAbase._vptr_ChNodeFEAbase[0x2f])
                                                             (this);
                                          if (2 < ((long *)CONCAT44(extraout_var_07,iVar14))[1]) {
                                            uVar15 = (ulong)(off + 0xb);
                                            if ((w->
                                                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                ).m_storage.m_rows <= (long)uVar15)
                                            goto LAB_0066a477;
                                            if ((long)uVar15 <
                                                (R->
                                                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                ).m_storage.m_rows) {
                                              auVar28._8_8_ = 0;
                                              auVar28._0_8_ =
                                                   (w->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  ).m_storage.m_data[uVar15];
                                              pdVar13 = (R->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  ).m_storage.m_data;
                                              auVar12._8_8_ = 0;
                                              auVar12._0_8_ = pdVar13[uVar15];
                                              auVar40._8_8_ = 0;
                                              auVar40._0_8_ =
                                                   c * *(double *)
                                                        (*(long *)CONCAT44(extraout_var_07,iVar14) +
                                                        0x10);
                                              auVar1 = vfmadd213sd_fma(auVar40,auVar28,auVar12);
                                              pdVar13[uVar15] = auVar1._0_8_;
                                              return;
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    __assert_fail("index >= 0 && index < size()",
                  "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                  "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                 );
  }
LAB_0066a477:
  __assert_fail("index >= 0 && index < size()",
                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0xb5,
                "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 0>::operator()(Index) const [Derived = Eigen::Matrix<double, -1, 1>, Level = 0]"
               );
}

Assistant:

void ChNodeFEAxyzDDD::NodeIntLoadResidual_Mv(const unsigned int off,
                                            ChVectorDynamic<>& R,
                                            const ChVectorDynamic<>& w,
                                            const double c) {
    R(off + 0) += c * GetMass() * w(off + 0);
    R(off + 1) += c * GetMass() * w(off + 1);
    R(off + 2) += c * GetMass() * w(off + 2);
    R(off + 3) += c * GetMassDiagonal()(0) * w(off + 3);  // unuseful? mass for D isalways zero..
    R(off + 4) += c * GetMassDiagonal()(1) * w(off + 4);
    R(off + 5) += c * GetMassDiagonal()(2) * w(off + 5);
    R(off + 6) += c * GetMassDiagonalDD()(0) * w(off + 6);
    R(off + 7) += c * GetMassDiagonalDD()(1) * w(off + 7);
    R(off + 8) += c * GetMassDiagonalDD()(2) * w(off + 8);
    R(off + 9) += c * GetMassDiagonalDDD()(0) * w(off + 9);
    R(off + 10) += c * GetMassDiagonalDDD()(1) * w(off + 10);
    R(off + 11) += c * GetMassDiagonalDDD()(2) * w(off + 11);
}